

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::copyTo
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *copy)

{
  int iVar1;
  vec<Glucose::vec<unsigned_int>_> *in_RSI;
  vec<Glucose::vec<unsigned_int>_> *in_RDI;
  int i;
  vec<unsigned_int> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 local_14;
  
  vec<Glucose::vec<unsigned_int>_>::size(in_RDI);
  vec<Glucose::vec<unsigned_int>_>::growTo
            ((vec<Glucose::vec<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_14 = 0;
  while( true ) {
    iVar2 = local_14;
    iVar1 = vec<Glucose::vec<unsigned_int>_>::size(in_RDI);
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffc8 = vec<Glucose::vec<unsigned_int>_>::operator[](in_RDI,local_14);
    vec<Glucose::vec<unsigned_int>_>::operator[](in_RSI,local_14);
    vec<unsigned_int>::memCopyTo
              ((vec<unsigned_int> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_14 = local_14 + 1;
  }
  vec<char>::memCopyTo
            ((vec<char> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
             (vec<char> *)in_stack_ffffffffffffffc8);
  vec<int>::memCopyTo((vec<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                      (vec<int> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void copyTo(OccLists &copy) const {
	
	copy.occs.growTo(occs.size());
	for(int i = 0;i<occs.size();i++)
	    occs[i].memCopyTo(copy.occs[i]);
	dirty.memCopyTo(copy.dirty);
	dirties.memCopyTo(copy.dirties);
    }